

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Option_group * __thiscall
CLI::App::add_option_group<CLI::Option_group>
          (App *this,string *group_name,string *group_description)

{
  element_type *peVar1;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  IncorrectConstruction *this_00;
  shared_ptr<CLI::Option_group> option_group;
  undefined1 local_71;
  element_type *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  App_p local_60;
  string local_50;
  App *local_30;
  
  bVar2 = CLI::detail::valid_alias_name_string(group_name);
  if (bVar2) {
    local_70 = (element_type *)0x0;
    local_30 = this;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CLI::Option_group,std::allocator<CLI::Option_group>,std::__cxx11::string,std::__cxx11::string&,CLI::App*>
              (&local_68,(Option_group **)&local_70,(allocator<CLI::Option_group> *)&local_71,
               group_description,group_name,&local_30);
    peVar1 = local_70;
    if ((local_70 == (element_type *)0x0) ||
       (local_68._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      local_60.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_60.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_pi;
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
      }
    }
    local_60.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_70;
    add_subcommand(this,&local_60);
    if (local_60.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
    if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_pi);
    }
    return (Option_group *)peVar1;
  }
  this_00 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"option group names may not contain newlines or null characters",""
            );
  CLI::IncorrectConstruction::IncorrectConstruction(this_00,&local_50);
  __cxa_throw(this_00,&CLI::IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

T *add_option_group(std::string group_name, std::string group_description = "") {
        if(!detail::valid_alias_name_string(group_name)) {
            throw IncorrectConstruction("option group names may not contain newlines or null characters");
        }
        auto option_group = std::make_shared<T>(std::move(group_description), group_name, this);
        auto *ptr = option_group.get();
        // move to App_p for overload resolution on older gcc versions
        App_p app_ptr = std::dynamic_pointer_cast<App>(option_group);
        add_subcommand(std::move(app_ptr));
        return ptr;
    }